

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O0

gdImagePtr gdImageCreateFromGd2Ctx(gdIOCtxPtr in)

{
  int iVar1;
  int b;
  int g;
  int r;
  int a;
  int ch;
  gdImagePtr im;
  char *compBuf;
  int local_88;
  int bytesPerPixel;
  int compMax;
  int chunkPos;
  uLongf chunkLen;
  int chunkMax;
  int chunkNum;
  uchar *chunkBuf;
  t_chunk_info *chunkIdx;
  int local_58;
  int fmt;
  int vers;
  int xhi;
  int xlo;
  int yhi;
  int ylo;
  int y;
  int x;
  int cy;
  int cx;
  int cs;
  int nc;
  int ncy;
  int ncx;
  int i;
  int sy;
  int sx;
  gdIOCtxPtr in_local;
  
  chunkBuf = (uchar *)0x0;
  _chunkMax = (char *)0x0;
  chunkLen._4_4_ = 0;
  chunkLen._0_4_ = 0;
  bytesPerPixel = 0;
  local_88 = 0;
  im = (gdImagePtr)0x0;
  _sy = in;
  _a = _gd2CreateFromFile(in,&i,&ncx,&cy,&local_58,(int *)((long)&chunkIdx + 4),&nc,&cs,
                          (t_chunk_info **)&chunkBuf);
  if (_a == (gdImagePtr)0x0) {
    in_local = (gdIOCtxPtr)0x0;
  }
  else {
    compBuf._4_4_ = 1;
    if (_a->trueColor != 0) {
      compBuf._4_4_ = 4;
    }
    cx = nc * cs;
    if ((chunkIdx._4_4_ == 2) || (chunkIdx._4_4_ == 4)) {
      local_88 = 0;
      for (ncy = 0; ncy < cx; ncy = ncy + 1) {
        if (local_88 < *(int *)(chunkBuf + (long)ncy * 8 + 4)) {
          local_88 = *(int *)(chunkBuf + (long)ncy * 8 + 4);
        }
      }
      local_88 = local_88 + 1;
      chunkLen._0_4_ = cy * compBuf._4_4_ * cy;
      _chunkMax = (char *)gdCalloc((long)(int)chunkLen,1);
      if ((_chunkMax == (char *)0x0) ||
         (im = (gdImagePtr)gdCalloc((long)local_88,1), im == (gdImagePtr)0x0)) {
LAB_0011c083:
        gdImageDestroy(_a);
        if (_chunkMax != (char *)0x0) {
          gdFree(_chunkMax);
        }
        if (im != (gdImagePtr)0x0) {
          gdFree(im);
        }
        if (chunkBuf != (uchar *)0x0) {
          gdFree(chunkBuf);
        }
        return (gdImagePtr)0x0;
      }
    }
    for (y = 0; y < cs; y = y + 1) {
      for (x = 0; x < nc; x = x + 1) {
        xlo = y * cy;
        xhi = xlo + cy;
        if (_a->sy < xhi) {
          xhi = _a->sy;
        }
        if ((chunkIdx._4_4_ == 2) || (chunkIdx._4_4_ == 4)) {
          _compMax = (uLongf)(int)chunkLen;
          iVar1 = _gd2ReadChunk(*(int *)(chunkBuf + (long)chunkLen._4_4_ * 8),(char *)im,
                                *(int *)(chunkBuf + (long)chunkLen._4_4_ * 8 + 4),_chunkMax,
                                (uLongf *)&compMax,_sy);
          if (iVar1 == 0) goto LAB_0011c083;
          bytesPerPixel = 0;
        }
        for (yhi = xlo; yhi < xhi; yhi = yhi + 1) {
          vers = x * cy;
          fmt = vers + cy;
          if (_a->sx < fmt) {
            fmt = _a->sx;
          }
          ylo = vers;
          if ((chunkIdx._4_4_ == 2) || (chunkIdx._4_4_ == 4)) {
            for (; ylo < fmt; ylo = ylo + 1) {
              if (_a->trueColor == 0) {
                _a->pixels[yhi][ylo] = _chunkMax[bytesPerPixel];
                bytesPerPixel = bytesPerPixel + 1;
              }
              else {
                _a->tpixels[yhi][ylo] =
                     (uint)(byte)_chunkMax[bytesPerPixel] * 0x1000000 +
                     (uint)(byte)_chunkMax[bytesPerPixel + 1] * 0x10000 +
                     (uint)(byte)_chunkMax[bytesPerPixel + 2] * 0x100 +
                     (uint)(byte)_chunkMax[bytesPerPixel + 3];
                bytesPerPixel = bytesPerPixel + 4;
              }
            }
          }
          else {
            for (; ylo < fmt; ylo = ylo + 1) {
              if (_a->trueColor == 0) {
                iVar1 = gdGetByte(&r,_sy);
                if (iVar1 == 0) {
                  gd_error("gd2: EOF while reading\n");
                  goto LAB_0011c083;
                }
                _a->pixels[yhi][ylo] = (uchar)r;
              }
              else {
                iVar1 = gdGetInt(_a->tpixels[yhi] + ylo,_sy);
                if (iVar1 == 0) {
                  gd_error("gd2: EOF while reading\n");
                  goto LAB_0011c083;
                }
              }
            }
          }
        }
        chunkLen._4_4_ = chunkLen._4_4_ + 1;
      }
    }
    gdFree(_chunkMax);
    gdFree(im);
    gdFree(chunkBuf);
    in_local = (gdIOCtxPtr)_a;
  }
  return (gdImagePtr)in_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Ctx (gdIOCtxPtr in)
{
	int sx, sy;
	int i;
	int ncx, ncy, nc, cs, cx, cy;
	int x, y, ylo, yhi, xlo, xhi;
	int vers, fmt;
	t_chunk_info *chunkIdx = NULL;	/* So we can gdFree it with impunity. */
	unsigned char *chunkBuf = NULL;	/* So we can gdFree it with impunity. */
	int chunkNum = 0;
	int chunkMax = 0;
	uLongf chunkLen;
	int chunkPos = 0;
	int compMax = 0;
	int bytesPerPixel;
	char *compBuf = NULL;		/* So we can gdFree it with impunity. */

	gdImagePtr im;

	/* Get the header */
	im =
	    _gd2CreateFromFile (in, &sx, &sy, &cs, &vers, &fmt, &ncx, &ncy,
	                        &chunkIdx);
	if (im == NULL) {
		/* No need to free chunkIdx as _gd2CreateFromFile does it for us. */
		return 0;
	}

	bytesPerPixel = im->trueColor ? 4 : 1;
	nc = ncx * ncy;

	if (gd2_compressed (fmt)) {
		/* Find the maximum compressed chunk size. */
		compMax = 0;
		for (i = 0; (i < nc); i++) {
			if (chunkIdx[i].size > compMax) {
				compMax = chunkIdx[i].size;
			};
		};
		compMax++;

		/* Allocate buffers */
		chunkMax = cs * bytesPerPixel * cs;
		chunkBuf = gdCalloc (chunkMax, 1);
		if (!chunkBuf) {
			goto fail;
		}
		compBuf = gdCalloc (compMax, 1);
		if (!compBuf) {
			goto fail;
		}

		GD2_DBG (printf ("Largest compressed chunk is %d bytes\n", compMax));
	};

	/*      if ( (ncx != sx / cs) || (ncy != sy / cs)) { */
	/*              goto fail2; */
	/*      }; */

	/* Read the data... */
	for (cy = 0; (cy < ncy); cy++) {
		for (cx = 0; (cx < ncx); cx++) {

			ylo = cy * cs;
			yhi = ylo + cs;
			if (yhi > im->sy) {
				yhi = im->sy;
			};

			GD2_DBG (printf
			         ("Processing Chunk %d (%d, %d), y from %d to %d\n",
			          chunkNum, cx, cy, ylo, yhi));

			if (gd2_compressed (fmt)) {

				chunkLen = chunkMax;

				if (!_gd2ReadChunk (chunkIdx[chunkNum].offset,
				                    compBuf,
				                    chunkIdx[chunkNum].size,
				                    (char *) chunkBuf, &chunkLen, in)) {
					GD2_DBG (printf ("Error reading comproessed chunk\n"));
					goto fail;
				};

				chunkPos = 0;
			};

			for (y = ylo; (y < yhi); y++) {

				xlo = cx * cs;
				xhi = xlo + cs;
				if (xhi > im->sx) {
					xhi = im->sx;
				};
				/*GD2_DBG(printf("y=%d: ",y)); */
				if (!gd2_compressed (fmt)) {
					for (x = xlo; x < xhi; x++) {

						if (im->trueColor) {
							if (!gdGetInt (&im->tpixels[y][x], in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
						} else {
							int ch;
							if (!gdGetByte (&ch, in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
							im->pixels[y][x] = ch;
						}
					}
				} else {
					for (x = xlo; x < xhi; x++) {
						if (im->trueColor) {
							/* 2.0.1: work around a gcc bug by being verbose.
							   TBB */
							int a = chunkBuf[chunkPos++] << 24;
							int r = chunkBuf[chunkPos++] << 16;
							int g = chunkBuf[chunkPos++] << 8;
							int b = chunkBuf[chunkPos++];
							/* 2.0.11: tpixels */
							im->tpixels[y][x] = a + r + g + b;
						} else {
							im->pixels[y][x] = chunkBuf[chunkPos++];
						}
					};
				};
				/*GD2_DBG(printf("\n")); */
			};
			chunkNum++;
		};
	};

	GD2_DBG (printf ("Freeing memory\n"));

	gdFree (chunkBuf);
	gdFree (compBuf);
	gdFree (chunkIdx);

	GD2_DBG (printf ("Done\n"));

	return im;

fail:
	gdImageDestroy (im);
	if (chunkBuf) {
		gdFree (chunkBuf);
	}
	if (compBuf) {
		gdFree (compBuf);
	}
	if (chunkIdx) {
		gdFree (chunkIdx);
	}
	return 0;
}